

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O3

void RemoveSingleNodeFromList(aiNode *nd)

{
  uint uVar1;
  aiNode *paVar2;
  ulong uVar3;
  
  if (((nd != (aiNode *)0x0) && (nd->mNumChildren == 0)) &&
     (paVar2 = nd->mParent, paVar2 != (aiNode *)0x0)) {
    uVar1 = paVar2->mNumChildren;
    if ((ulong)uVar1 != 0) {
      uVar3 = 0;
      do {
        if (paVar2->mChildren[uVar3] == nd) {
          paVar2->mNumChildren = uVar1 - 1;
          if ((uint)uVar3 < uVar1 - 1) {
            do {
              paVar2->mChildren[uVar3] = paVar2->mChildren[uVar3 + 1];
              uVar3 = uVar3 + 1;
            } while (uVar3 < paVar2->mNumChildren);
          }
          aiNode::~aiNode(nd);
          operator_delete(nd);
          return;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return;
}

Assistant:

void RemoveSingleNodeFromList(aiNode* nd)
{
    if (!nd || nd->mNumChildren || !nd->mParent)return;
    aiNode* par = nd->mParent;
    for (unsigned int i = 0; i < par->mNumChildren;++i) {
        if (par->mChildren[i] == nd) {
            --par->mNumChildren;
            for (;i < par->mNumChildren;++i) {
                par->mChildren[i] = par->mChildren[i+1];
            }
            delete nd;
            break;
        }
    }
}